

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::SmallFinalizableHeapBlockT
          (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this,
          HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
          *bucket,ushort objectSize,ushort objectCount,HeapBlockType blockType)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 *in_FS_OFFSET;
  
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::SmallNormalHeapBlockT
            (&this->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,
             &bucket->super_HeapBucket,objectSize,objectCount,blockType);
  (this->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
  super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock._vptr_HeapBlock =
       (_func_int **)&PTR_WBSetBit_0037c270;
  if (this->finalizeCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x7a,"(this->finalizeCount == 0)","this->finalizeCount == 0");
    if (!bVar3) goto LAB_002ab27f;
    *puVar1 = 0;
  }
  if (this->pendingDisposeCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x7b,"(this->pendingDisposeCount == 0)","this->pendingDisposeCount == 0");
    if (!bVar3) goto LAB_002ab27f;
    *puVar1 = 0;
  }
  if (this->disposedObjectList != (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x7c,"(this->disposedObjectList == nullptr)",
                       "this->disposedObjectList == nullptr");
    if (!bVar3) goto LAB_002ab27f;
    *puVar1 = 0;
  }
  if (this->disposedObjectListTail != (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x7d,"(this->disposedObjectListTail == nullptr)",
                       "this->disposedObjectListTail == nullptr");
    if (!bVar3) goto LAB_002ab27f;
    *puVar1 = 0;
  }
  if (this->isPendingDispose == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x7e,"(!this->isPendingDispose)","!this->isPendingDispose");
    if (!bVar3) {
LAB_002ab27f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return;
}

Assistant:

SmallFinalizableHeapBlockT<TBlockAttributes>::SmallFinalizableHeapBlockT(HeapBucketT<SmallFinalizableWithBarrierHeapBlockT<TBlockAttributes>> * bucket, ushort objectSize, ushort objectCount, HeapBlockType blockType)
    : SmallNormalHeapBlockT<TBlockAttributes>(bucket, objectSize, objectCount, blockType)
{
    // We used AllocZ
    Assert(this->finalizeCount == 0);
    Assert(this->pendingDisposeCount == 0);
    Assert(this->disposedObjectList == nullptr);
    Assert(this->disposedObjectListTail == nullptr);
    Assert(!this->isPendingDispose);
}